

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_getNextSeparatorTest_Test::
~OpenDDLParserTest_getNextSeparatorTest_Test(OpenDDLParserTest_getNextSeparatorTest_Test *this)

{
  OpenDDLParserTest_getNextSeparatorTest_Test *this_local;
  
  ~OpenDDLParserTest_getNextSeparatorTest_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, getNextSeparatorTest) {
    char tokenlist[] = "abc, \na";
    char *in(&tokenlist[0]);
    char *end(&tokenlist[strlen("abc, \na")]);

    bool res(true);
    res = isSeparator(*in);
    EXPECT_FALSE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
    in = getNextSeparator(in, end);
    res = isSeparator(*in);
    EXPECT_TRUE(res);
}